

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::anon_unknown_31::FailureTest::~FailureTest(FailureTest *this)

{
  pointer pcVar1;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__FailureTest_001439e8;
  pcVar1 = (this->error_message_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->error_message_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->loc_).file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->loc_).file.field_2) {
    operator_delete(pcVar1);
  }
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00143368;
  std::
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ::~unique_ptr(&(this->super_Test).gtest_flag_saver_);
  operator_delete(this);
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}